

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O0

size_t __thiscall CastMessage::size_content(CastMessage *this)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uchar *pcls;
  size_type size;
  size_t sVar8;
  CastMessage *this_local;
  
  sVar1 = ec::msg_protoc3::size_var<unsigned_int,void>
                    ((msg_protoc3 *)this,1,this->_protocol_version,true);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sVar3 = ec::msg_protoc3::size_str((msg_protoc3 *)this,2,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sVar4 = ec::msg_protoc3::size_str((msg_protoc3 *)this,3,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sVar5 = ec::msg_protoc3::size_str((msg_protoc3 *)this,4,pcVar2);
  sVar6 = ec::msg_protoc3::size_var<unsigned_int,void>
                    ((msg_protoc3 *)this,5,this->_payload_type,true);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sVar7 = ec::msg_protoc3::size_str((msg_protoc3 *)this,6,pcVar2);
  pcls = std::__cxx11::
         basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
         ::data(&this->_payload_binary);
  size = std::__cxx11::
         basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
         ::size(&this->_payload_binary);
  sVar8 = ec::msg_protoc3::size_cls((msg_protoc3 *)this,7,pcls,size);
  return sVar1 + sVar3 + sVar4 + sVar5 + sVar6 + sVar7 + sVar8;
}

Assistant:

size_t size_content() override {
        return
            size_var(id_protocol_version, _protocol_version, true) +
            size_str(id_source_id, _source_id.c_str()) +
            size_str(id_destination_id, _destination_id.c_str()) +
            size_str(id_namespace, _namespace.c_str()) +
            size_var(id_payload_type, _payload_type, true) +
            size_str(id_payload_utf8, _payload_utf8.c_str()) +
            size_cls(id_payload_binary, _payload_binary.data(), _payload_binary.size());
    }